

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadNumArgs
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this,int min_args)

{
  int iVar1;
  
  iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (iVar1 < min_args) {
    TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x21278e);
  }
  return iVar1;
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }